

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Vec_Wrd_t * Gia_ManSimPatSim2(Gia_Man_t *pGia)

{
  int iVar1;
  Vec_Wrd_t *vSimsIn;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  int nWords;
  Vec_Wrd_t *vSims;
  word *__s;
  ulong uVar7;
  int iVar8;
  long lVar9;
  word *pwVar10;
  int iVar11;
  ulong uVar12;
  word *pwVar13;
  long lVar14;
  uint uVar15;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar16;
  
  vSimsIn = pGia->vSimsPi;
  pVVar2 = pGia->vCis;
  uVar7 = (long)vSimsIn->nSize / (long)pVVar2->nSize;
  nWords = (int)uVar7;
  iVar8 = pGia->nObjs * nWords;
  iVar1 = iVar8 * 2;
  vSims = (Vec_Wrd_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar8 * 2 - 1U) {
    iVar11 = iVar1;
  }
  vSims->nSize = 0;
  vSims->nCap = iVar11;
  if (iVar11 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar11 << 3);
  }
  vSims->pArray = __s;
  vSims->nSize = iVar1;
  memset(__s,0,(long)iVar1 << 3);
  if (vSimsIn->nSize % pVVar2->nSize != 0) {
    __assert_fail("Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0xce,"Vec_Wrd_t *Gia_ManSimPatSim2(Gia_Man_t *)");
  }
  Gia_ManSimPatAssignInputs2(pGia,nWords,vSims,vSimsIn);
  iVar1 = pGia->nObjs;
  uVar7 = uVar7 & 0xffffffff;
  if ((0 < (long)iVar1) && (pGVar3 = pGia->pObjs, pGVar3 != (Gia_Obj_t *)0x0)) {
    lVar9 = (long)nWords;
    pwVar10 = __s + lVar9;
    iVar11 = 0;
    lVar14 = 0;
    pwVar13 = __s;
    do {
      uVar12 = *(ulong *)(pGVar3 + lVar14);
      uVar19 = (uint)uVar12;
      if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar19) {
        uVar18 = uVar19 & 0x1fffffff;
        if ((int)((int)lVar14 - uVar18) < 0) goto LAB_007c76d2;
        uVar16 = (uint)(uVar12 >> 0x20);
        uVar15 = uVar16 & 0x1fffffff;
        if ((int)((int)lVar14 - uVar15) < 0) goto LAB_007c76d2;
        if (((-1 < (int)uVar19) && ((int)(uVar12 & 0x1fffffff) != 0x1fffffff)) && (uVar18 < uVar15))
        {
          __assert_fail("!Gia_ObjIsXor(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                        ,0xb5,
                        "void Gia_ManSimPatSimAnd2(Gia_Man_t *, int, Gia_Obj_t *, int, Vec_Wrd_t *)"
                       );
        }
        if (0 < nWords) {
          uVar17 = 0;
          do {
            uVar4 = __s[(long)(int)(((uVar16 >> 0x1d & 1) + iVar11 + uVar15 * -2) * nWords) + uVar17
                       ];
            uVar5 = __s[(long)(int)((((uint)(uVar12 >> 0x1d) & 1) + iVar11 + uVar18 * -2) * nWords)
                        + uVar17];
            pwVar13[uVar17] = uVar4 & uVar5;
            pwVar10[uVar17] = ~(uVar4 & uVar5);
            uVar17 = uVar17 + 1;
          } while (uVar7 != uVar17);
        }
      }
      lVar14 = lVar14 + 1;
      pwVar10 = pwVar10 + lVar9 * 2;
      pwVar13 = pwVar13 + lVar9 * 2;
      iVar11 = iVar11 + 2;
    } while (lVar14 != iVar1);
  }
  lVar9 = (long)pGia->vCos->nSize;
  if (0 < lVar9) {
    piVar6 = pGia->vCos->pArray;
    lVar14 = 0;
    do {
      iVar11 = piVar6[lVar14];
      if (((long)iVar11 < 0) || (iVar1 <= iVar11)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) {
        return vSims;
      }
      uVar19 = *(uint *)(pGia->pObjs + iVar11);
      uVar18 = uVar19 & 0x1fffffff;
      if ((int)(iVar11 - uVar18) < 0) {
LAB_007c76d2:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      if (0 < nWords) {
        uVar12 = 0;
        do {
          __s[(long)(iVar11 * nWords) + uVar12] =
               __s[(long)(int)(((uVar19 >> 0x1d & 1) + iVar11 * 2 + uVar18 * -2) * nWords) + uVar12]
          ;
          uVar12 = uVar12 + 1;
        } while (uVar7 != uVar12);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar9);
  }
  return vSims;
}

Assistant:

Vec_Wrd_t * Gia_ManSimPatSim2( Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj;
    int i, nWords = Vec_WrdSize(pGia->vSimsPi) / Gia_ManCiNum(pGia);
    Vec_Wrd_t * vSims = Vec_WrdStart( Gia_ManObjNum(pGia) * nWords * 2 );
    assert( Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0 );
    Gia_ManSimPatAssignInputs2( pGia, nWords, vSims, pGia->vSimsPi );
    Gia_ManForEachAnd( pGia, pObj, i ) 
        Gia_ManSimPatSimAnd2( pGia, i, pObj, nWords, vSims );
    Gia_ManForEachCo( pGia, pObj, i )
        Gia_ManSimPatSimPo2( pGia, Gia_ObjId(pGia, pObj), pObj, nWords, vSims );
    return vSims;
}